

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O2

string * proto2_unittest::MapEnumLite_Name_abi_cxx11_(MapEnumLite value)

{
  int iVar1;
  string *psVar2;
  
  if (MapEnumLite_Name[abi:cxx11](proto2_unittest::MapEnumLite)::kDummy == '\0') {
    iVar1 = __cxa_guard_acquire(&MapEnumLite_Name[abi:cxx11](proto2_unittest::MapEnumLite)::kDummy);
    if (iVar1 != 0) {
      MapEnumLite_Name::kDummy =
           google::protobuf::internal::InitializeEnumStrings
                     ((EnumEntry *)MapEnumLite_entries,(int *)MapEnumLite_entries_by_number,3,
                      (ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
                       *)MapEnumLite_strings_abi_cxx11_);
      __cxa_guard_release(&MapEnumLite_Name[abi:cxx11](proto2_unittest::MapEnumLite)::kDummy);
    }
  }
  iVar1 = google::protobuf::internal::LookUpEnumName
                    ((EnumEntry *)MapEnumLite_entries,(int *)MapEnumLite_entries_by_number,3,value);
  if (iVar1 == -1) {
    google::protobuf::internal::InitProtobufDefaults();
    psVar2 = (string *)&google::protobuf::internal::fixed_address_empty_string;
  }
  else {
    psVar2 = (string *)(MapEnumLite_strings_abi_cxx11_ + (long)iVar1 * 0x20);
  }
  return psVar2;
}

Assistant:

const ::std::string& MapEnumLite_Name(MapEnumLite value) {
  static const bool kDummy = ::google::protobuf::internal::InitializeEnumStrings(
      MapEnumLite_entries, MapEnumLite_entries_by_number, 3,
      MapEnumLite_strings);
  (void)kDummy;

  int idx = ::google::protobuf::internal::LookUpEnumName(MapEnumLite_entries,
                                  MapEnumLite_entries_by_number,
                                  3, value);
  return idx == -1 ? ::google::protobuf::internal::GetEmptyString() : MapEnumLite_strings[idx].get();
}